

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::LogFail<signed_char>
          (ClearTest *this,bool use_sub_data,GLenum internalformat,char *data,char *reference,
          GLsizei count)

{
  ostringstream *this_00;
  ulong uVar1;
  string the_log;
  stringstream number;
  char local_210;
  undefined7 uStack_20f;
  long local_200 [2];
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  ClearTest *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = local_1e0;
  local_1d0 = this;
  local_1c8 = reference;
  local_1c0 = data;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"The test of ","");
  std::__cxx11::string::append((char *)&local_1f0);
  std::__cxx11::string::append((char *)&local_1f0);
  if (0 < count) {
    uVar1 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      local_210 = local_1c0[uVar1];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_210,1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_1f0,CONCAT71(uStack_20f,local_210));
      if ((long *)CONCAT71(uStack_20f,local_210) != local_200) {
        operator_delete((long *)CONCAT71(uStack_20f,local_210),local_200[0] + 1);
      }
      if (count - 1 != uVar1) {
        std::__cxx11::string::append((char *)&local_1f0);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar1 = uVar1 + 1;
    } while ((uint)count != uVar1);
  }
  std::__cxx11::string::append((char *)&local_1f0);
  if (0 < count) {
    uVar1 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      local_210 = local_1c8[uVar1];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_210,1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_1f0,CONCAT71(uStack_20f,local_210));
      if ((long *)CONCAT71(uStack_20f,local_210) != local_200) {
        operator_delete((long *)CONCAT71(uStack_20f,local_210),local_200[0] + 1);
      }
      if (count - 1 != uVar1) {
        std::__cxx11::string::append((char *)&local_1f0);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar1 = uVar1 + 1;
    } while ((uint)count != uVar1);
  }
  std::__cxx11::string::append((char *)&local_1f0);
  local_1b8._0_8_ = ((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_1f0,local_1e8)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  return;
}

Assistant:

void ClearTest::LogFail(bool use_sub_data, glw::GLenum internalformat, const T* data, const T* reference,
						const glw::GLsizei count)
{
	(void)internalformat;
	std::string the_log = "The test of ";

	if (use_sub_data)
	{
		the_log.append("ClearNamedBufferSubData has failed for internalformat ");
	}
	else
	{
		the_log.append("ClearNamedBufferData has failed for internalformat ");
	}

	//the_log.append(glu::getPixelFormatName(internalformat));
	the_log.append(". Cleared buffer data is equal to [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << data[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("], but [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << reference[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("] was expected.");

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}